

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMuxes.c
# Opt level: O1

int Gia_MuxRef_rec(Gia_Man_t *p,int iObj)

{
  uint uVar1;
  Gia_Obj_t *pGVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Gia_Obj_t *pGVar6;
  
  iVar5 = 0;
  while( true ) {
    if ((p->pMuxes == (uint *)0x0) || (p->pMuxes[iObj] == 0)) {
      return iVar5;
    }
    if ((iObj < 0) || (p->nObjs <= iObj)) {
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    pGVar6 = p->pObjs + (uint)iObj;
    iVar3 = p->pRefs[(uint)iObj];
    p->pRefs[(uint)iObj] = iVar3 + 1;
    if (iVar3 != 0) {
      return iVar5;
    }
    if (p->nObjs <= iObj) break;
    iVar3 = Gia_MuxRef_rec(p,iObj - (*(uint *)pGVar6 & 0x1fffffff));
    pGVar2 = p->pObjs;
    if ((pGVar6 < pGVar2) || (pGVar2 + p->nObjs <= pGVar6)) break;
    iVar4 = Gia_MuxRef_rec(p,(int)((ulong)((long)pGVar6 - (long)pGVar2) >> 2) * -0x55555555 -
                             (*(uint *)&pGVar6->field_0x4 & 0x1fffffff));
    iObj = 0xffffffff;
    if (p->pMuxes != (uint *)0x0) {
      pGVar2 = p->pObjs;
      if ((pGVar6 < pGVar2) || (pGVar2 + p->nObjs <= pGVar6)) break;
      uVar1 = p->pMuxes[(int)((ulong)((long)pGVar6 - (long)pGVar2) >> 2) * -0x55555555];
      if (uVar1 != 0) {
        if ((int)uVar1 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x12f,"int Abc_Lit2Var(int)");
        }
        iObj = uVar1 >> 1;
      }
    }
    iVar5 = iVar5 + iVar3 + iVar4 + 1;
  }
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

int Gia_MuxRef_rec( Gia_Man_t * p, int iObj )
{
    Gia_Obj_t * pObj;
    if ( !Gia_ObjIsMuxId(p, iObj) )
        return 0;
    pObj = Gia_ManObj( p, iObj );
    if ( Gia_ObjRefInc(p, pObj) )
        return 0;
    return Gia_MuxRef_rec( p, Gia_ObjFaninId0p(p, pObj) ) + 
           Gia_MuxRef_rec( p, Gia_ObjFaninId1p(p, pObj) ) + 
           Gia_MuxRef_rec( p, Gia_ObjFaninId2p(p, pObj) ) + 1;
}